

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O1

void __thiscall CLIntercept::writeReport(CLIntercept *this,ostream *os)

{
  long lVar1;
  long lVar2;
  char cVar3;
  long *plVar4;
  ostream *poVar5;
  ulong uVar6;
  iterator iVar7;
  mapped_type *pmVar8;
  ostream *poVar9;
  const_iterator cVar10;
  _Base_ptr p_Var11;
  undefined8 uVar12;
  _Hash_node_base *p_Var13;
  pointer pbVar14;
  _Hash_node_base *p_Var15;
  ulong uVar16;
  _Base_ptr p_Var17;
  pointer pbVar18;
  _Base_ptr p_Var19;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  keys;
  cl_device_id device;
  long local_80;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  _Base_ptr local_60;
  key_type *local_58;
  ostream *local_50;
  CDeviceInfoMap *local_48;
  _Base_ptr local_40;
  key_type local_38;
  
  cVar3 = (char)os;
  if ((this->m_Config).FinishAfterEnqueue == true) {
    std::__ostream_insert<char,std::char_traits<char>>
              (os,"*** WARNING *** FinishAfterEnqueue Enabled!",0x2b);
    std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + cVar3);
    std::ostream::put(cVar3);
    plVar4 = (long *)std::ostream::flush();
    std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
    std::ostream::put((char)plVar4);
    std::ostream::flush();
  }
  if ((this->m_Config).FlushAfterEnqueue == true) {
    std::__ostream_insert<char,std::char_traits<char>>
              (os,"*** WARNING *** FlushAfterEnqueue Enabled!",0x2a);
    std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + cVar3);
    std::ostream::put(cVar3);
    plVar4 = (long *)std::ostream::flush();
    std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
    std::ostream::put((char)plVar4);
    std::ostream::flush();
  }
  if ((this->m_Config).NullEnqueue == true) {
    std::__ostream_insert<char,std::char_traits<char>>
              (os,"*** WARNING *** NullEnqueue Enabled!",0x24);
    std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + cVar3);
    std::ostream::put(cVar3);
    plVar4 = (long *)std::ostream::flush();
    std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
    std::ostream::put((char)plVar4);
    std::ostream::flush();
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"Total Enqueues: ",0x10);
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)os);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  plVar4 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
  std::ostream::put((char)plVar4);
  std::ostream::flush();
  if ((this->m_Config).LeakChecking == true) {
    std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + cVar3);
    std::ostream::put(cVar3);
    poVar5 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Leak Checking:",0xe);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    CObjectTracker::writeReport(&this->m_ObjectTracker,os);
  }
  if ((this->m_LongKernelNameMap)._M_h._M_element_count != 0) {
    std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + cVar3);
    std::ostream::put(cVar3);
    poVar5 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Kernel name mapping:",0x14);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + cVar3);
    std::ostream::put(cVar3);
    poVar5 = (ostream *)std::ostream::flush();
    lVar1 = *(long *)poVar5;
    lVar2 = *(long *)(lVar1 + -0x18);
    *(uint *)(poVar5 + lVar2 + 0x18) = *(uint *)(poVar5 + lVar2 + 0x18) & 0xffffff4f | 0x80;
    *(undefined8 *)(poVar5 + *(long *)(lVar1 + -0x18) + 0x10) = 10;
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Short Name",10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
    lVar1 = *(long *)poVar5;
    lVar2 = *(long *)(lVar1 + -0x18);
    *(uint *)(poVar5 + lVar2 + 0x18) = *(uint *)(poVar5 + lVar2 + 0x18) & 0xffffff4f | 0x80;
    *(undefined8 *)(poVar5 + *(long *)(lVar1 + -0x18) + 0x10) = 1;
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Long Name",9);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    for (p_Var13 = (this->m_LongKernelNameMap)._M_h._M_before_begin._M_nxt;
        p_Var13 != (_Hash_node_base *)0x0; p_Var13 = p_Var13->_M_nxt) {
      lVar1 = *(long *)os;
      lVar2 = *(long *)(lVar1 + -0x18);
      *(uint *)(os + lVar2 + 0x18) = *(uint *)(os + lVar2 + 0x18) & 0xffffff4f | 0x80;
      *(undefined8 *)(os + *(long *)(lVar1 + -0x18) + 0x10) = 10;
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (os,(char *)p_Var13[5]._M_nxt,(long)p_Var13[6]._M_nxt);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
      lVar1 = *(long *)poVar5;
      lVar2 = *(long *)(lVar1 + -0x18);
      *(uint *)(poVar5 + lVar2 + 0x18) = *(uint *)(poVar5 + lVar2 + 0x18) & 0xffffff4f | 0x80;
      *(undefined8 *)(poVar5 + *(long *)(lVar1 + -0x18) + 0x10) = 1;
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,(char *)p_Var13[1]._M_nxt,(long)p_Var13[2]._M_nxt);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
    }
  }
  local_50 = os;
  if (((this->m_Config).HostPerformanceTiming == true) &&
     ((this->m_HostTimingStatsMap)._M_h._M_element_count != 0)) {
    std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + cVar3);
    std::ostream::put(cVar3);
    poVar5 = (ostream *)std::ostream::flush();
    local_80 = 0x20;
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,"Host Performance Timing Results:",0x20);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    local_78.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (key_type *)0x0;
    local_78.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (key_type *)0x0;
    local_78.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::reserve(&local_78,(this->m_HostTimingStatsMap)._M_h._M_element_count);
    p_Var13 = (this->m_HostTimingStatsMap)._M_h._M_before_begin._M_nxt;
    if (p_Var13 == (_Hash_node_base *)0x0) {
      uVar16 = 0;
    }
    else {
      p_Var15 = (_Hash_node_base *)0x20;
      uVar16 = 0;
      do {
        if (p_Var13[2]._M_nxt != (_Hash_node_base *)0x0) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&local_78,(value_type *)(p_Var13 + 1));
          uVar16 = (long)&(p_Var13[8]._M_nxt)->_M_nxt + uVar16;
          if (p_Var15 < p_Var13[2]._M_nxt) {
            p_Var15 = p_Var13[2]._M_nxt;
          }
        }
        p_Var13 = p_Var13->_M_nxt;
      } while (p_Var13 != (_Hash_node_base *)0x0);
      local_80 = (long)(int)p_Var15;
    }
    pbVar14 = local_78.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    pbVar18 = local_78.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (local_78.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_78.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      uVar6 = (long)local_78.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_78.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5;
      lVar1 = 0x3f;
      if (uVar6 != 0) {
        for (; uVar6 >> lVar1 == 0; lVar1 = lVar1 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                (local_78.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 local_78.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar1 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (pbVar18,pbVar14);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + cVar3);
    std::ostream::put(cVar3);
    poVar5 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Total Time (ns): ",0x11);
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + cVar3);
    std::ostream::put(cVar3);
    poVar5 = (ostream *)std::ostream::flush();
    lVar1 = *(long *)poVar5;
    lVar2 = *(long *)(lVar1 + -0x18);
    *(uint *)(poVar5 + lVar2 + 0x18) = *(uint *)(poVar5 + lVar2 + 0x18) & 0xffffff4f | 0x80;
    *(long *)(poVar5 + *(long *)(lVar1 + -0x18) + 0x10) = local_80;
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Function Name",0xd);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
    lVar1 = *(long *)poVar5;
    lVar2 = *(long *)(lVar1 + -0x18);
    *(uint *)(poVar5 + lVar2 + 0x18) = *(uint *)(poVar5 + lVar2 + 0x18) & 0xffffff4f | 0x80;
    *(undefined8 *)(poVar5 + *(long *)(lVar1 + -0x18) + 0x10) = 6;
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Calls",5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
    lVar1 = *(long *)poVar5;
    lVar2 = *(long *)(lVar1 + -0x18);
    *(uint *)(poVar5 + lVar2 + 0x18) = *(uint *)(poVar5 + lVar2 + 0x18) & 0xffffff4f | 0x80;
    *(undefined8 *)(poVar5 + *(long *)(lVar1 + -0x18) + 0x10) = 0xd;
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Time (ns)",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
    lVar1 = *(long *)poVar5;
    lVar2 = *(long *)(lVar1 + -0x18);
    *(uint *)(poVar5 + lVar2 + 0x18) = *(uint *)(poVar5 + lVar2 + 0x18) & 0xffffff4f | 0x80;
    *(undefined8 *)(poVar5 + *(long *)(lVar1 + -0x18) + 0x10) = 8;
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Time (%)",8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
    lVar1 = *(long *)poVar5;
    lVar2 = *(long *)(lVar1 + -0x18);
    *(uint *)(poVar5 + lVar2 + 0x18) = *(uint *)(poVar5 + lVar2 + 0x18) & 0xffffff4f | 0x80;
    *(undefined8 *)(poVar5 + *(long *)(lVar1 + -0x18) + 0x10) = 0xd;
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Average (ns)",0xc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
    lVar1 = *(long *)poVar5;
    lVar2 = *(long *)(lVar1 + -0x18);
    *(uint *)(poVar5 + lVar2 + 0x18) = *(uint *)(poVar5 + lVar2 + 0x18) & 0xffffff4f | 0x80;
    *(undefined8 *)(poVar5 + *(long *)(lVar1 + -0x18) + 0x10) = 0xd;
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Min (ns)",8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
    lVar1 = *(long *)poVar5;
    lVar2 = *(long *)(lVar1 + -0x18);
    *(uint *)(poVar5 + lVar2 + 0x18) = *(uint *)(poVar5 + lVar2 + 0x18) & 0xffffff4f | 0x80;
    *(undefined8 *)(poVar5 + *(long *)(lVar1 + -0x18) + 0x10) = 0xd;
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Max (ns)",8);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    local_58 = local_78.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    if (local_78.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_78.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      local_60 = (_Base_ptr)CONCAT44(local_60._4_4_,(float)uVar16);
      pbVar18 = local_78.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        iVar7 = std::
                _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SHostTimingStats>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SHostTimingStats>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::find(&(this->m_HostTimingStatsMap)._M_h,pbVar18);
        if (iVar7.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SHostTimingStats>,_true>
            ._M_cur == (__node_type *)0x0) {
LAB_001696d2:
          uVar12 = std::__throw_out_of_range("_Map_base::at");
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_78);
          _Unwind_Resume(uVar12);
        }
        lVar1 = *(long *)local_50;
        lVar2 = *(long *)(lVar1 + -0x18);
        *(uint *)(local_50 + lVar2 + 0x18) = *(uint *)(local_50 + lVar2 + 0x18) & 0xffffff4f | 0x80;
        *(long *)(local_50 + *(long *)(lVar1 + -0x18) + 0x10) = local_80;
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (local_50,(pbVar18->_M_dataplus)._M_p,pbVar18->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
        lVar1 = *(long *)poVar5;
        lVar2 = *(long *)(lVar1 + -0x18);
        *(uint *)(poVar5 + lVar2 + 0x18) = *(uint *)(poVar5 + lVar2 + 0x18) & 0xffffff4f | 0x80;
        *(undefined8 *)(poVar5 + *(long *)(lVar1 + -0x18) + 0x10) = 6;
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
        lVar1 = *(long *)poVar5;
        lVar2 = *(long *)(lVar1 + -0x18);
        *(uint *)(poVar5 + lVar2 + 0x18) = *(uint *)(poVar5 + lVar2 + 0x18) & 0xffffff4f | 0x80;
        *(undefined8 *)(poVar5 + *(long *)(lVar1 + -0x18) + 0x10) = 0xd;
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
        lVar1 = *(long *)poVar5;
        *(uint *)(poVar5 + *(long *)(lVar1 + -0x18) + 0x18) =
             *(uint *)(poVar5 + *(long *)(lVar1 + -0x18) + 0x18) & 0xffffff4f | 0x80;
        *(undefined8 *)(poVar5 + *(long *)(lVar1 + -0x18) + 0x10) = 7;
        *(uint *)(poVar5 + *(long *)(lVar1 + -0x18) + 0x18) =
             *(uint *)(poVar5 + *(long *)(lVar1 + -0x18) + 0x18) & 0xfffffefb | 4;
        *(undefined8 *)(poVar5 + *(long *)(lVar1 + -0x18) + 8) = 2;
        poVar5 = std::ostream::_M_insert<double>
                           ((double)(((float)*(ulong *)((long)iVar7.
                                                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SHostTimingStats>,_true>
                                                  ._M_cur + 0x40) * 100.0) / local_60._0_4_));
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"%, ",3);
        lVar1 = *(long *)poVar5;
        lVar2 = *(long *)(lVar1 + -0x18);
        *(uint *)(poVar5 + lVar2 + 0x18) = *(uint *)(poVar5 + lVar2 + 0x18) & 0xffffff4f | 0x80;
        *(undefined8 *)(poVar5 + *(long *)(lVar1 + -0x18) + 0x10) = 0xd;
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
        lVar1 = *(long *)poVar5;
        lVar2 = *(long *)(lVar1 + -0x18);
        *(uint *)(poVar5 + lVar2 + 0x18) = *(uint *)(poVar5 + lVar2 + 0x18) & 0xffffff4f | 0x80;
        *(undefined8 *)(poVar5 + *(long *)(lVar1 + -0x18) + 0x10) = 0xd;
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
        lVar1 = *(long *)poVar5;
        lVar2 = *(long *)(lVar1 + -0x18);
        *(uint *)(poVar5 + lVar2 + 0x18) = *(uint *)(poVar5 + lVar2 + 0x18) & 0xffffff4f | 0x80;
        *(undefined8 *)(poVar5 + *(long *)(lVar1 + -0x18) + 0x10) = 0xd;
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
        pbVar18 = pbVar18 + 1;
      } while (pbVar18 != local_58);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_78);
  }
  if (((this->m_Config).DevicePerformanceTiming == true) &&
     ((this->m_DeviceTimingStatsMap)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0)) {
    p_Var11 = (this->m_DeviceTimingStatsMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_40 = &(this->m_DeviceTimingStatsMap)._M_t._M_impl.super__Rb_tree_header._M_header;
    if (p_Var11 != local_40) {
      local_48 = &this->m_DeviceInfoMap;
      do {
        poVar5 = local_50;
        local_38 = *(key_type *)(p_Var11 + 1);
        pmVar8 = std::
                 map<_cl_device_id_*,_CLIntercept::SDeviceInfo,_std::less<_cl_device_id_*>,_std::allocator<std::pair<_cl_device_id_*const,_CLIntercept::SDeviceInfo>_>_>
                 ::operator[](local_48,&local_38);
        cVar3 = (char)poVar5;
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + cVar3);
        std::ostream::put(cVar3);
        poVar9 = (ostream *)std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar9,"Device Performance Timing Results for ",0x26);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar9,(pmVar8->NameForReport)._M_dataplus._M_p,
                            (pmVar8->NameForReport)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,":",1);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
        std::ostream::put((char)poVar9);
        std::ostream::flush();
        local_78.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (key_type *)0x0;
        local_78.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (key_type *)0x0;
        local_78.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::reserve(&local_78,*(size_type *)(p_Var11 + 2));
        p_Var17 = p_Var11[1]._M_right;
        if (p_Var17 == (_Base_ptr)0x0) {
          local_80 = 0x20;
          uVar16 = 0;
        }
        else {
          p_Var19 = (_Base_ptr)0x20;
          uVar16 = 0;
          do {
            if (p_Var17->_M_left != (_Base_ptr)0x0) {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back(&local_78,(value_type *)&p_Var17->_M_parent);
              uVar16 = uVar16 + *(long *)(p_Var17 + 2);
              if (p_Var19 < p_Var17->_M_left) {
                p_Var19 = p_Var17->_M_left;
              }
            }
            p_Var17 = *(_Base_ptr *)p_Var17;
          } while (p_Var17 != (_Base_ptr)0x0);
          local_80 = (long)(int)p_Var19;
        }
        pbVar14 = local_78.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        pbVar18 = local_78.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (local_78.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_78.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          uVar6 = (long)local_78.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_78.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 5;
          lVar1 = 0x3f;
          if (uVar6 != 0) {
            for (; uVar6 >> lVar1 == 0; lVar1 = lVar1 + -1) {
            }
          }
          std::
          __introsort_loop<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                    (local_78.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     local_78.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar1 ^ 0x3f) * 2 ^ 0x7e);
          std::
          __final_insertion_sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_less_iter>
                    (pbVar18,pbVar14);
        }
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + cVar3);
        std::ostream::put(cVar3);
        poVar9 = (ostream *)std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"Total Time (ns): ",0x11);
        poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
        std::ostream::put((char)poVar9);
        std::ostream::flush();
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + cVar3);
        std::ostream::put(cVar3);
        poVar5 = (ostream *)std::ostream::flush();
        lVar1 = *(long *)poVar5;
        lVar2 = *(long *)(lVar1 + -0x18);
        *(uint *)(poVar5 + lVar2 + 0x18) = *(uint *)(poVar5 + lVar2 + 0x18) & 0xffffff4f | 0x80;
        *(long *)(poVar5 + *(long *)(lVar1 + -0x18) + 0x10) = local_80;
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Function Name",0xd);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
        lVar1 = *(long *)poVar5;
        lVar2 = *(long *)(lVar1 + -0x18);
        *(uint *)(poVar5 + lVar2 + 0x18) = *(uint *)(poVar5 + lVar2 + 0x18) & 0xffffff4f | 0x80;
        *(undefined8 *)(poVar5 + *(long *)(lVar1 + -0x18) + 0x10) = 6;
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Calls",5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
        lVar1 = *(long *)poVar5;
        lVar2 = *(long *)(lVar1 + -0x18);
        *(uint *)(poVar5 + lVar2 + 0x18) = *(uint *)(poVar5 + lVar2 + 0x18) & 0xffffff4f | 0x80;
        *(undefined8 *)(poVar5 + *(long *)(lVar1 + -0x18) + 0x10) = 0xd;
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Time (ns)",9);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
        lVar1 = *(long *)poVar5;
        lVar2 = *(long *)(lVar1 + -0x18);
        *(uint *)(poVar5 + lVar2 + 0x18) = *(uint *)(poVar5 + lVar2 + 0x18) & 0xffffff4f | 0x80;
        *(undefined8 *)(poVar5 + *(long *)(lVar1 + -0x18) + 0x10) = 8;
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Time (%)",8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
        lVar1 = *(long *)poVar5;
        lVar2 = *(long *)(lVar1 + -0x18);
        *(uint *)(poVar5 + lVar2 + 0x18) = *(uint *)(poVar5 + lVar2 + 0x18) & 0xffffff4f | 0x80;
        *(undefined8 *)(poVar5 + *(long *)(lVar1 + -0x18) + 0x10) = 0xd;
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Average (ns)",0xc);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
        lVar1 = *(long *)poVar5;
        lVar2 = *(long *)(lVar1 + -0x18);
        *(uint *)(poVar5 + lVar2 + 0x18) = *(uint *)(poVar5 + lVar2 + 0x18) & 0xffffff4f | 0x80;
        *(undefined8 *)(poVar5 + *(long *)(lVar1 + -0x18) + 0x10) = 0xd;
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Min (ns)",8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
        lVar1 = *(long *)poVar5;
        lVar2 = *(long *)(lVar1 + -0x18);
        *(uint *)(poVar5 + lVar2 + 0x18) = *(uint *)(poVar5 + lVar2 + 0x18) & 0xffffff4f | 0x80;
        *(undefined8 *)(poVar5 + *(long *)(lVar1 + -0x18) + 0x10) = 0xd;
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Max (ns)",8);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
        pbVar18 = local_78.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        local_60 = p_Var11;
        if (local_78.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_78.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          local_58 = (key_type *)CONCAT44(local_58._4_4_,(float)uVar16);
          pbVar14 = local_78.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          do {
            cVar10 = std::
                     _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SDeviceTimingStats>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SDeviceTimingStats>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SDeviceTimingStats>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SDeviceTimingStats>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                             *)&p_Var11[1]._M_parent,pbVar14);
            if (cVar10.
                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SDeviceTimingStats>,_true>
                ._M_cur == (__node_type *)0x0) {
              std::__throw_out_of_range("_Map_base::at");
              goto LAB_001696d2;
            }
            lVar1 = *(long *)local_50;
            lVar2 = *(long *)(lVar1 + -0x18);
            *(uint *)(local_50 + lVar2 + 0x18) =
                 *(uint *)(local_50 + lVar2 + 0x18) & 0xffffff4f | 0x80;
            *(long *)(local_50 + *(long *)(lVar1 + -0x18) + 0x10) = local_80;
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               (local_50,(pbVar14->_M_dataplus)._M_p,pbVar14->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
            lVar1 = *(long *)poVar5;
            lVar2 = *(long *)(lVar1 + -0x18);
            *(uint *)(poVar5 + lVar2 + 0x18) = *(uint *)(poVar5 + lVar2 + 0x18) & 0xffffff4f | 0x80;
            *(undefined8 *)(poVar5 + *(long *)(lVar1 + -0x18) + 0x10) = 6;
            poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
            lVar1 = *(long *)poVar5;
            lVar2 = *(long *)(lVar1 + -0x18);
            *(uint *)(poVar5 + lVar2 + 0x18) = *(uint *)(poVar5 + lVar2 + 0x18) & 0xffffff4f | 0x80;
            *(undefined8 *)(poVar5 + *(long *)(lVar1 + -0x18) + 0x10) = 0xd;
            poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
            lVar1 = *(long *)poVar5;
            *(uint *)(poVar5 + *(long *)(lVar1 + -0x18) + 0x18) =
                 *(uint *)(poVar5 + *(long *)(lVar1 + -0x18) + 0x18) & 0xffffff4f | 0x80;
            *(undefined8 *)(poVar5 + *(long *)(lVar1 + -0x18) + 0x10) = 7;
            *(uint *)(poVar5 + *(long *)(lVar1 + -0x18) + 0x18) =
                 *(uint *)(poVar5 + *(long *)(lVar1 + -0x18) + 0x18) & 0xfffffefb | 4;
            *(undefined8 *)(poVar5 + *(long *)(lVar1 + -0x18) + 8) = 2;
            poVar5 = std::ostream::_M_insert<double>
                               ((double)(((float)*(ulong *)((long)cVar10.
                                                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SDeviceTimingStats>,_true>
                                                  ._M_cur + 0x40) * 100.0) / local_58._0_4_));
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,"%, ",3);
            lVar1 = *(long *)poVar5;
            lVar2 = *(long *)(lVar1 + -0x18);
            *(uint *)(poVar5 + lVar2 + 0x18) = *(uint *)(poVar5 + lVar2 + 0x18) & 0xffffff4f | 0x80;
            *(undefined8 *)(poVar5 + *(long *)(lVar1 + -0x18) + 0x10) = 0xd;
            poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
            lVar1 = *(long *)poVar5;
            lVar2 = *(long *)(lVar1 + -0x18);
            *(uint *)(poVar5 + lVar2 + 0x18) = *(uint *)(poVar5 + lVar2 + 0x18) & 0xffffff4f | 0x80;
            *(undefined8 *)(poVar5 + *(long *)(lVar1 + -0x18) + 0x10) = 0xd;
            poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
            lVar1 = *(long *)poVar5;
            lVar2 = *(long *)(lVar1 + -0x18);
            *(uint *)(poVar5 + lVar2 + 0x18) = *(uint *)(poVar5 + lVar2 + 0x18) & 0xffffff4f | 0x80;
            *(undefined8 *)(poVar5 + *(long *)(lVar1 + -0x18) + 0x10) = 0xd;
            poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
            std::ostream::put((char)poVar5);
            std::ostream::flush();
            pbVar14 = pbVar14 + 1;
          } while (pbVar14 != pbVar18);
        }
        p_Var11 = (_Base_ptr)std::_Rb_tree_increment(local_60);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_78);
      } while (p_Var11 != local_40);
    }
  }
  if ((this->m_Config).DevicePerfCounterEventBasedSampling == true) {
    reportMDAPICounters(this,local_50);
  }
  return;
}

Assistant:

void CLIntercept::writeReport(
    std::ostream& os )
{
    if( config().FinishAfterEnqueue )
    {
        os << "*** WARNING *** FinishAfterEnqueue Enabled!" << std::endl << std::endl;
    }
    if( config().FlushAfterEnqueue )
    {
        os << "*** WARNING *** FlushAfterEnqueue Enabled!" << std::endl << std::endl;
    }
    if( config().NullEnqueue )
    {
        os << "*** WARNING *** NullEnqueue Enabled!" << std::endl << std::endl;
    }

    os << "Total Enqueues: " << m_EnqueueCounter.load(std::memory_order_relaxed) << std::endl << std::endl;

    if( config().LeakChecking )
    {
        os << std::endl << "Leak Checking:" << std::endl;
        m_ObjectTracker.writeReport( os );
    }

    if( !m_LongKernelNameMap.empty() )
    {
        os << std::endl << "Kernel name mapping:" << std::endl;

        os << std::endl
            << std::right << std::setw(10) << "Short Name" << ", "
            << std::right << std::setw(1) << "Long Name" << std::endl;

        CLongKernelNameMap::const_iterator i = m_LongKernelNameMap.begin();
        while( i != m_LongKernelNameMap.end() )
        {
            os << std::right << std::setw(10) << i->second << ", "
                << std::right << std::setw(1) << i->first << std::endl;

            ++i;
        }
    }

    if( config().HostPerformanceTiming &&
        !m_HostTimingStatsMap.empty() )
    {
        os << std::endl << "Host Performance Timing Results:" << std::endl;

        std::vector<std::string> keys;
        keys.reserve(m_HostTimingStatsMap.size());

        uint64_t    totalTotalNS = 0;
        size_t      longestName = 32;

        CHostTimingStatsMap::const_iterator i = m_HostTimingStatsMap.begin();
        while( i != m_HostTimingStatsMap.end() )
        {
            const std::string& name = (*i).first;
            const SHostTimingStats& hostTimingStats = (*i).second;

            if( !name.empty() )
            {
                keys.push_back(name);
                totalTotalNS += hostTimingStats.TotalNS;
                longestName = std::max< size_t >( name.length(), longestName );
            }

            ++i;
        }

        std::sort(keys.begin(), keys.end());

        os << std::endl << "Total Time (ns): " << totalTotalNS << std::endl;

        os << std::endl
            << std::right << std::setw(longestName) << "Function Name" << ", "
            << std::right << std::setw( 6) << "Calls" << ", "
            << std::right << std::setw(13) << "Time (ns)" << ", "
            << std::right << std::setw( 8) << "Time (%)" << ", "
            << std::right << std::setw(13) << "Average (ns)" << ", "
            << std::right << std::setw(13) << "Min (ns)" << ", "
            << std::right << std::setw(13) << "Max (ns)" << std::endl;

        for( const auto& name : keys )
        {
            const SHostTimingStats& hostTimingStats = m_HostTimingStatsMap.at(name);

            os << std::right << std::setw(longestName) << name << ", "
                << std::right << std::setw( 6) << hostTimingStats.NumberOfCalls << ", "
                << std::right << std::setw(13) << hostTimingStats.TotalNS << ", "
                << std::right << std::setw( 7) << std::fixed << std::setprecision(2) << hostTimingStats.TotalNS * 100.0f / totalTotalNS << "%, "
                << std::right << std::setw(13) << hostTimingStats.TotalNS / hostTimingStats.NumberOfCalls << ", "
                << std::right << std::setw(13) << hostTimingStats.MinNS << ", "
                << std::right << std::setw(13) << hostTimingStats.MaxNS << std::endl;
        }
    }

    if( config().DevicePerformanceTiming &&
        !m_DeviceTimingStatsMap.empty() )
    {
        CDeviceDeviceTimingStatsMap::const_iterator id = m_DeviceTimingStatsMap.begin();
        while( id != m_DeviceTimingStatsMap.end() )
        {
            const cl_device_id  device = (*id).first;
            const CDeviceTimingStatsMap& dtsm = (*id).second;

            const SDeviceInfo&  deviceInfo = m_DeviceInfoMap[device];

            os << std::endl << "Device Performance Timing Results for " << deviceInfo.NameForReport << ":" << std::endl;

            std::vector<std::string> keys;
            keys.reserve(dtsm.size());

            cl_ulong    totalTotalNS = 0;
            size_t      longestName = 32;

            CDeviceTimingStatsMap::const_iterator i = dtsm.begin();
            while( i != dtsm.end() )
            {
                const std::string& name = (*i).first;
                const SDeviceTimingStats& deviceTimingStats = (*i).second;

                if( !name.empty() )
                {
                    keys.push_back(name);
                    totalTotalNS += deviceTimingStats.TotalNS;
                    longestName = std::max< size_t >( name.length(), longestName );
                }

                ++i;
            }

            std::sort(keys.begin(), keys.end());

            os << std::endl << "Total Time (ns): " << totalTotalNS << std::endl;

            os << std::endl
                << std::right << std::setw(longestName) << "Function Name" << ", "
                << std::right << std::setw( 6) << "Calls" << ", "
                << std::right << std::setw(13) << "Time (ns)" << ", "
                << std::right << std::setw( 8) << "Time (%)" << ", "
                << std::right << std::setw(13) << "Average (ns)" << ", "
                << std::right << std::setw(13) << "Min (ns)" << ", "
                << std::right << std::setw(13) << "Max (ns)" << std::endl;

            for( const auto& name : keys )
            {
                const SDeviceTimingStats& deviceTimingStats = dtsm.at(name);

                os << std::right << std::setw(longestName) << name << ", "
                    << std::right << std::setw( 6) << deviceTimingStats.NumberOfCalls << ", "
                    << std::right << std::setw(13) << deviceTimingStats.TotalNS << ", "
                    << std::right << std::setw( 7) << std::fixed << std::setprecision(2) << deviceTimingStats.TotalNS * 100.0f / totalTotalNS << "%, "
                    << std::right << std::setw(13) << deviceTimingStats.TotalNS / deviceTimingStats.NumberOfCalls << ", "
                    << std::right << std::setw(13) << deviceTimingStats.MinNS << ", "
                    << std::right << std::setw(13) << deviceTimingStats.MaxNS << std::endl;
            }

            ++id;
        }
    }

#if defined(USE_MDAPI)
    if( config().DevicePerfCounterEventBasedSampling )
    {
        reportMDAPICounters( os );
    }
#endif
}